

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast6.c
# Opt level: O2

word Extra_Truth6MinimumRoundMany1(word t,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  word wVar1;
  ulong uVar2;
  ulong uVar3;
  char pCanonPerm1 [16];
  uint local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_4c = *pCanonPhase;
  switch(local_4c >> 7) {
  case 0:
    wVar1 = Extra_Truth6MinimumRoundMany_noEBFC(t,pStore,pCanonPerm,pCanonPhase);
    return wVar1;
  default:
    wVar1 = Extra_Truth6MinimumRoundMany(t,pStore,pCanonPerm,pCanonPhase);
    return wVar1;
  case 2:
    local_4c = local_4c ^ 0x40;
    local_48 = *(undefined8 *)pCanonPerm;
    uStack_40 = *(undefined8 *)(pCanonPerm + 8);
    uVar2 = Extra_Truth6MinimumRoundMany_noEBFC(t,pStore,pCanonPerm,pCanonPhase);
    uVar3 = Extra_Truth6MinimumRoundMany_noEBFC(~t,pStore,(char *)&local_48,&local_4c);
    break;
  case 3:
    local_4c = local_4c ^ 0x40;
    local_48 = *(undefined8 *)pCanonPerm;
    uStack_40 = *(undefined8 *)(pCanonPerm + 8);
    uVar2 = Extra_Truth6MinimumRoundMany(t,pStore,pCanonPerm,pCanonPhase);
    uVar3 = Extra_Truth6MinimumRoundMany(~t,pStore,(char *)&local_48,&local_4c);
  }
  if (uVar3 < uVar2) {
    *pCanonPhase = local_4c;
    *(undefined8 *)pCanonPerm = local_48;
    *(undefined8 *)(pCanonPerm + 8) = uStack_40;
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

word Extra_Truth6MinimumRoundMany1( word t, int* pStore, char* pCanonPerm, unsigned* pCanonPhase )
{
    word tMin0, tMin=t;
    char pCanonPerm1[16];
    unsigned uCanonPhase1;
    switch ((* pCanonPhase) >> 7)
    {
    case 0 :
        {

    	    return Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 1 :
        {            
            return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
        }
    case 2 :
        { 
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany_noEBFC( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany_noEBFC( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    case 3 :
        {
            uCanonPhase1 = *pCanonPhase;
            uCanonPhase1 ^= (1 << 6);
            memcpy(pCanonPerm1,pCanonPerm,sizeof(char)*16);
            tMin0 = Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
            tMin =  Extra_Truth6MinimumRoundMany( ~t, pStore, pCanonPerm1, &uCanonPhase1);
            if(tMin0 <=tMin)
                return tMin0;
            else
            {
                *pCanonPhase = uCanonPhase1;
                memcpy(pCanonPerm,pCanonPerm1,sizeof(char)*16);
                return tMin;
            }
        }
    }
    return Extra_Truth6MinimumRoundMany( t, pStore, pCanonPerm, pCanonPhase);
}